

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3FkLocateIndex(Parse *pParse,Table *pParent,FKey *pFKey,Index **ppIdx,int **paiCol)

{
  uint uVar1;
  char *zRight;
  Index *pIVar2;
  Column *pCVar3;
  int iVar4;
  int iVar5;
  int *p;
  ulong uVar6;
  long lVar7;
  Index **ppIVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  char **ppcVar13;
  
  uVar1 = pFKey->nCol;
  zRight = pFKey->aCol[0].zCol;
  if ((ulong)uVar1 == 1) {
    if (-1 < (long)pParent->iPKey) {
      if (zRight == (char *)0x0) {
        return 0;
      }
      iVar4 = sqlite3_stricmp(pParent->aCol[pParent->iPKey].zName,zRight);
      if (iVar4 == 0) {
        return 0;
      }
    }
    p = (int *)0x0;
  }
  else if (paiCol == (int **)0x0) {
    p = (int *)0x0;
  }
  else {
    p = (int *)sqlite3DbMallocRaw(pParse->db,uVar1 * 4);
    if (p == (int *)0x0) {
      return 1;
    }
    *paiCol = p;
  }
  ppIVar8 = &pParent->pIndex;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  do {
    pIVar2 = *ppIVar8;
    if (pIVar2 == (Index *)0x0) {
      if (pParse->disableTriggers == '\0') {
        sqlite3ErrorMsg(pParse,"foreign key mismatch - \"%w\" referencing \"%w\"",
                        pFKey->pFrom->zName,pFKey->zTo);
      }
      sqlite3DbFree(pParse->db,p);
      return 1;
    }
    if ((uVar1 == pIVar2->nColumn) && (pIVar2->onError != '\0')) {
      if (zRight == (char *)0x0) {
        if ((pIVar2->field_0x4f & 3) == 2) {
          if (p != (int *)0x0) {
            for (lVar7 = 0; uVar6 << 2 != lVar7; lVar7 = lVar7 + 4) {
              *(int *)((long)p + lVar7) = (&pFKey->aCol[0].iFrom)[lVar7];
            }
          }
LAB_0017e7c0:
          *ppIdx = pIVar2;
          return 0;
        }
      }
      else {
        for (uVar9 = 0; uVar10 = uVar6, uVar9 != uVar6; uVar9 = uVar9 + 1) {
          iVar4 = pIVar2->aiColumn[uVar9];
          pCVar3 = pParent->aCol;
          pcVar11 = pCVar3[iVar4].zColl;
          if (pcVar11 == (char *)0x0) {
            pcVar11 = "BINARY";
          }
          iVar5 = sqlite3_stricmp(pIVar2->azColl[uVar9],pcVar11);
          uVar10 = uVar9;
          if (iVar5 != 0) break;
          pcVar11 = pCVar3[iVar4].zName;
          uVar12 = (ulong)uVar1;
          ppcVar13 = &pFKey->aCol[0].zCol;
          while( true ) {
            if (uVar12 == 0) goto LAB_0017e71b;
            iVar4 = sqlite3_stricmp(*ppcVar13,pcVar11);
            if (iVar4 == 0) break;
            ppcVar13 = ppcVar13 + 2;
            uVar12 = uVar12 - 1;
          }
          if (p != (int *)0x0) {
            p[uVar9] = ((sColMap *)(ppcVar13 + -1))->iFrom;
          }
          if ((int)uVar12 == 0) break;
        }
LAB_0017e71b:
        if ((uint)uVar10 == uVar1) goto LAB_0017e7c0;
      }
    }
    ppIVar8 = &pIVar2->pNext;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3FkLocateIndex(
  Parse *pParse,                  /* Parse context to store any error in */
  Table *pParent,                 /* Parent table of FK constraint pFKey */
  FKey *pFKey,                    /* Foreign key to find index for */
  Index **ppIdx,                  /* OUT: Unique index on parent table */
  int **paiCol                    /* OUT: Map of index columns in pFKey */
){
  Index *pIdx = 0;                    /* Value to return via *ppIdx */
  int *aiCol = 0;                     /* Value to return via *paiCol */
  int nCol = pFKey->nCol;             /* Number of columns in parent key */
  char *zKey = pFKey->aCol[0].zCol;   /* Name of left-most parent key column */

  /* The caller is responsible for zeroing output parameters. */
  assert( ppIdx && *ppIdx==0 );
  assert( !paiCol || *paiCol==0 );
  assert( pParse );

  /* If this is a non-composite (single column) foreign key, check if it 
  ** maps to the INTEGER PRIMARY KEY of table pParent. If so, leave *ppIdx 
  ** and *paiCol set to zero and return early. 
  **
  ** Otherwise, for a composite foreign key (more than one column), allocate
  ** space for the aiCol array (returned via output parameter *paiCol).
  ** Non-composite foreign keys do not require the aiCol array.
  */
  if( nCol==1 ){
    /* The FK maps to the IPK if any of the following are true:
    **
    **   1) There is an INTEGER PRIMARY KEY column and the FK is implicitly 
    **      mapped to the primary key of table pParent, or
    **   2) The FK is explicitly mapped to a column declared as INTEGER
    **      PRIMARY KEY.
    */
    if( pParent->iPKey>=0 ){
      if( !zKey ) return 0;
      if( !sqlite3StrICmp(pParent->aCol[pParent->iPKey].zName, zKey) ) return 0;
    }
  }else if( paiCol ){
    assert( nCol>1 );
    aiCol = (int *)sqlite3DbMallocRaw(pParse->db, nCol*sizeof(int));
    if( !aiCol ) return 1;
    *paiCol = aiCol;
  }

  for(pIdx=pParent->pIndex; pIdx; pIdx=pIdx->pNext){
    if( pIdx->nColumn==nCol && pIdx->onError!=OE_None ){ 
      /* pIdx is a UNIQUE index (or a PRIMARY KEY) and has the right number
      ** of columns. If each indexed column corresponds to a foreign key
      ** column of pFKey, then this index is a winner.  */

      if( zKey==0 ){
        /* If zKey is NULL, then this foreign key is implicitly mapped to 
        ** the PRIMARY KEY of table pParent. The PRIMARY KEY index may be 
        ** identified by the test (Index.autoIndex==2).  */
        if( pIdx->autoIndex==2 ){
          if( aiCol ){
            int i;
            for(i=0; i<nCol; i++) aiCol[i] = pFKey->aCol[i].iFrom;
          }
          break;
        }
      }else{
        /* If zKey is non-NULL, then this foreign key was declared to
        ** map to an explicit list of columns in table pParent. Check if this
        ** index matches those columns. Also, check that the index uses
        ** the default collation sequences for each column. */
        int i, j;
        for(i=0; i<nCol; i++){
          int iCol = pIdx->aiColumn[i];     /* Index of column in parent tbl */
          char *zDfltColl;                  /* Def. collation for column */
          char *zIdxCol;                    /* Name of indexed column */

          /* If the index uses a collation sequence that is different from
          ** the default collation sequence for the column, this index is
          ** unusable. Bail out early in this case.  */
          zDfltColl = pParent->aCol[iCol].zColl;
          if( !zDfltColl ){
            zDfltColl = "BINARY";
          }
          if( sqlite3StrICmp(pIdx->azColl[i], zDfltColl) ) break;

          zIdxCol = pParent->aCol[iCol].zName;
          for(j=0; j<nCol; j++){
            if( sqlite3StrICmp(pFKey->aCol[j].zCol, zIdxCol)==0 ){
              if( aiCol ) aiCol[i] = pFKey->aCol[j].iFrom;
              break;
            }
          }
          if( j==nCol ) break;
        }
        if( i==nCol ) break;      /* pIdx is usable */
      }
    }
  }

  if( !pIdx ){
    if( !pParse->disableTriggers ){
      sqlite3ErrorMsg(pParse,
           "foreign key mismatch - \"%w\" referencing \"%w\"",
           pFKey->pFrom->zName, pFKey->zTo);
    }
    sqlite3DbFree(pParse->db, aiCol);
    return 1;
  }

  *ppIdx = pIdx;
  return 0;
}